

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O3

void Gia_ManInseSimulateObj(Gia_Man_t *p,int Id)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  void *pvVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  void *pvVar9;
  word wVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  
  if ((-1 < Id) && (Id < p->nObjs)) {
    uVar4 = *(ulong *)(p->pObjs + (uint)Id);
    uVar6 = (uint)uVar4;
    uVar7 = (uint)(uVar4 >> 0x20);
    if ((uVar4 & 0x1fffffff) == 0x1fffffff || (int)uVar6 < 0) {
      if ((int)uVar6 < 0 && (int)(uVar4 & 0x1fffffff) != 0x1fffffff) {
        pvVar5 = p->pData;
        lVar11 = (long)p->iData;
        iVar13 = p->iData * 2;
        pvVar1 = (void *)((long)pvVar5 + (long)(int)((Id - (uVar6 & 0x1fffffff)) * iVar13) * 8);
        pvVar2 = (void *)((long)pvVar1 + lVar11 * 8);
        pvVar9 = pvVar1;
        if ((uVar6 >> 0x1d & 1) == 0) {
          pvVar9 = pvVar2;
          pvVar2 = pvVar1;
        }
        if (0 < lVar11) {
          iVar13 = iVar13 * Id;
          lVar14 = 0;
          do {
            *(undefined8 *)((long)pvVar5 + lVar14 * 8 + (long)iVar13 * 8) =
                 *(undefined8 *)((long)pvVar2 + lVar14 * 8);
            *(undefined8 *)((long)pvVar5 + lVar14 * 8 + lVar11 * 8 + (long)iVar13 * 8) =
                 *(undefined8 *)((long)pvVar9 + lVar14 * 8);
            lVar14 = lVar14 + 1;
          } while (lVar11 != lVar14);
        }
      }
      else if ((~uVar6 & 0x9fffffff) == 0) {
        uVar7 = uVar7 & 0x1fffffff;
        iVar13 = p->vCis->nSize;
        if ((int)uVar7 < iVar13 - p->nRegs) {
          iVar13 = p->iData;
          if (0 < (long)iVar13) {
            pvVar1 = p->pData;
            lVar11 = 0;
            do {
              wVar10 = Gia_ManRandomW(0);
              *(word *)((long)pvVar1 + lVar11 * 8 + (long)(Id * iVar13 * 2) * 8) = wVar10;
              *(word *)((long)pvVar1 + lVar11 * 8 + (long)iVar13 * 8 + (long)(Id * iVar13 * 2) * 8)
                   = ~wVar10;
              lVar11 = lVar11 + 1;
            } while (lVar11 < p->iData);
          }
        }
        else {
          iVar12 = p->vCos->nSize;
          uVar7 = (iVar12 - iVar13) + uVar7;
          if (((int)uVar7 < 0) || (iVar12 <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar6 = p->vCos->pArray[uVar7];
          if (((int)uVar6 < 0) || ((uint)p->nObjs <= uVar6)) goto LAB_005a0440;
          lVar11 = (long)p->iData;
          if (0 < lVar11) {
            pvVar1 = p->pData;
            iVar13 = p->iData * 2;
            iVar12 = Id * iVar13;
            iVar13 = uVar6 * iVar13;
            lVar14 = 0;
            do {
              *(undefined8 *)((long)pvVar1 + lVar14 * 8 + (long)iVar12 * 8) =
                   *(undefined8 *)((long)pvVar1 + lVar14 * 8 + (long)iVar13 * 8);
              *(undefined8 *)((long)pvVar1 + lVar14 * 8 + lVar11 * 8 + (long)iVar12 * 8) =
                   *(undefined8 *)((long)pvVar1 + lVar14 * 8 + lVar11 * 8 + (long)iVar13 * 8);
              lVar14 = lVar14 + 1;
            } while (lVar11 != lVar14);
          }
        }
      }
      else {
        if ((~uVar4 & 0x1fffffff1fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                        ,0x9f,"void Gia_ManInseSimulateObj(Gia_Man_t *, int)");
        }
        lVar11 = (long)p->iData;
        if (0 < lVar11) {
          iVar13 = Id * p->iData;
          pvVar1 = p->pData;
          lVar14 = 0;
          do {
            *(undefined8 *)((long)pvVar1 + lVar14 * 8 + (long)(iVar13 * 2) * 8) = 0xffffffffffffffff
            ;
            *(undefined8 *)((long)pvVar1 + lVar14 * 8 + lVar11 * 8 + (long)(iVar13 * 2) * 8) = 0;
            lVar14 = lVar14 + 1;
          } while (lVar11 != lVar14);
        }
      }
    }
    else {
      pvVar5 = p->pData;
      lVar11 = (long)p->iData;
      iVar13 = p->iData * 2;
      pvVar1 = (void *)((long)pvVar5 + (long)(int)((Id - (uVar6 & 0x1fffffff)) * iVar13) * 8);
      pvVar2 = (void *)((long)pvVar1 + lVar11 * 8);
      pvVar9 = pvVar1;
      if ((uVar6 >> 0x1d & 1) == 0) {
        pvVar9 = pvVar2;
        pvVar2 = pvVar1;
      }
      pvVar1 = (void *)((long)pvVar5 + (long)(int)((Id - (uVar7 & 0x1fffffff)) * iVar13) * 8);
      pvVar3 = (void *)((long)pvVar1 + lVar11 * 8);
      pvVar8 = pvVar1;
      if ((uVar4 >> 0x3d & 1) == 0) {
        pvVar8 = pvVar3;
        pvVar3 = pvVar1;
      }
      if (0 < lVar11) {
        lVar14 = 0;
        do {
          *(ulong *)((long)pvVar5 + lVar14 * 8 + (long)(iVar13 * Id) * 8) =
               *(ulong *)((long)pvVar3 + lVar14 * 8) | *(ulong *)((long)pvVar2 + lVar14 * 8);
          *(ulong *)((long)pvVar5 + lVar14 * 8 + lVar11 * 8 + (long)(iVar13 * Id) * 8) =
               *(ulong *)((long)pvVar8 + lVar14 * 8) & *(ulong *)((long)pvVar9 + lVar14 * 8);
          lVar14 = lVar14 + 1;
        } while (lVar11 != lVar14);
      }
    }
    return;
  }
LAB_005a0440:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManInseSimulateObj( Gia_Man_t * p, int Id )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, Id );
    word * pData0, * pDataA0, * pDataB0;
    word * pData1, * pDataA1, * pDataB1;
    int i;
    if ( Gia_ObjIsAnd(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        if ( Gia_ObjFaninC0(pObj) )
        {
            pDataA1 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA0 = pDataA1 + p->iData;
            if ( Gia_ObjFaninC1(pObj) )
            {
                pDataB1 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB0 = pDataB1 + p->iData;
            }
            else 
            {
                pDataB0 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB1 = pDataB0 + p->iData;
            }
        }
        else 
        {
            pDataA0 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA1 = pDataA0 + p->iData;
            if ( Gia_ObjFaninC1(pObj) )
            {
                pDataB1 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB0 = pDataB1 + p->iData;
            }
            else 
            {
                pDataB0 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB1 = pDataB0 + p->iData;
            }
        }
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = pDataA0[i] | pDataB0[i], pData1[i] = pDataA1[i] & pDataB1[i];
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        if ( Gia_ObjFaninC0(pObj) )
        {
            pDataA1 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA0 = pDataA1 + p->iData;
        }
        else 
        {
            pDataA0 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA1 = pDataA0 + p->iData;
        }
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = pDataA0[i], pData1[i] = pDataA1[i];
    }
    else if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsPi(p, pObj) )
        {
            pData0  = Gia_ParTestObj( p, Id );
            pData1  = pData0 + p->iData;
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = Gia_ManRandomW(0), pData1[i] = ~pData0[i];
        }
        else
        {
            int Id2 = Gia_ObjId(p, Gia_ObjRoToRi(p, pObj));
            pData0  = Gia_ParTestObj( p, Id );
            pData1  = pData0 + p->iData;
            pDataA0 = Gia_ParTestObj( p, Id2 );
            pDataA1 = pDataA0 + p->iData;
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = pDataA0[i], pData1[i] = pDataA1[i];
        }
    }
    else if ( Gia_ObjIsConst0(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = ~(word)0, pData1[i] = 0;
    }
    else assert( 0 );
}